

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O2

ScalarType
mt::angle<mt::Vector3<mt::Dual<float>>>(Vector3<mt::Dual<float>_> *v1,Vector3<mt::Dual<float>_> *v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  RT x;
  float fVar9;
  ScalarType SVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  
  fVar1 = (v1->x).mReal;
  fVar2 = (v1->y).mReal;
  fVar3 = (v2->x).mReal;
  fVar11 = (v2->y).mReal;
  fVar4 = (v1->z).mReal;
  fVar19 = (v2->z).mReal;
  fVar14 = fVar19 * fVar19 + fVar11 * fVar11 + fVar3 * fVar3;
  fVar15 = fVar4 * fVar4 + fVar2 * fVar2 + fVar1 * fVar1;
  auVar13._0_4_ = fVar14 * fVar15;
  auVar13._4_4_ = fVar15;
  auVar13._8_8_ = 0;
  if (0.0 < auVar13._0_4_) {
    fVar5 = (v2->x).mDual;
    fVar6 = (v2->y).mDual;
    fVar7 = (v2->z).mDual;
    fVar16 = fVar5 * fVar3 + fVar6 * fVar11 + fVar7 * fVar19;
    fVar20 = (v1->y).mDual;
    fVar21 = (v1->z).mDual;
    fVar8 = (v1->x).mDual;
    fVar17 = fVar19 * fVar21 + fVar11 * fVar20;
    auVar18 = rsqrtss(ZEXT416((uint)fVar17),auVar13);
    fVar9 = auVar18._0_4_;
    fVar9 = (auVar13._0_4_ * fVar9 * fVar9 + -3.0) * fVar9 * -0.5;
    fVar19 = fVar4 * fVar19 + fVar2 * fVar11 + fVar1 * fVar3;
    fVar21 = fVar4 * fVar21 + fVar2 * fVar20 + fVar1 * fVar8;
    fVar20 = fVar19 * fVar9;
    fVar11 = fVar20;
    if (1.0 <= fVar20) {
      fVar11 = 1.0;
    }
    SVar10.mReal = acosf((float)(-(uint)(fVar20 < -1.0) & 0xbf800000 |
                                ~-(uint)(fVar20 < -1.0) & (uint)fVar11));
    auVar18._4_4_ = fVar21;
    auVar18._0_4_ = fVar20;
    auVar18._8_4_ = fVar4 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0;
    auVar18._12_4_ = fVar4 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0;
    auVar12._4_12_ = auVar18._4_12_;
    auVar12._0_4_ = fVar20 * fVar20;
    auVar13 = rsqrtss(auVar12,ZEXT416((uint)(1.0 - auVar12._0_4_)));
    fVar11 = auVar13._0_4_;
    SVar10.mDual = fVar11 * -0.5 *
                   (fVar9 * fVar19 * fVar9 * fVar9 * 0.5 *
                    (fVar14 * fVar21 * 2.0 + (fVar16 + fVar16) * fVar15) -
                   fVar9 * (fVar3 * fVar8 + fVar1 * fVar5 + fVar4 * fVar7 + fVar2 * fVar6 + fVar17))
                   * ((1.0 - auVar12._0_4_) * fVar11 * fVar11 + -3.0);
    return SVar10;
  }
  __assert_fail("ispositive(a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/erwincoumans[P]motion-toolkit/moto/Scalar.hpp"
                ,0x112,"Scalar mt::rsqrt(Scalar) [Scalar = mt::Dual<float>]");
}

Assistant:

typename Vector::ScalarType angle(const Vector& v1, const Vector& v2)
    {
        return acos(dot(v1, v2) * rsqrt(lengthSquared(v1) * lengthSquared(v2)));
    }